

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O2

OrderQty * __thiscall Application::queryOrderQty(OrderQty *__return_storage_ptr__,Application *this)

{
  ostream *poVar1;
  long value;
  double local_20;
  long local_18;
  
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<(poVar1,"OrderQty: ");
  std::istream::_M_extract<long>(&std::cin);
  local_20 = (double)local_18;
  FIX::OrderQty::OrderQty(__return_storage_ptr__,&local_20);
  return __return_storage_ptr__;
}

Assistant:

FIX::OrderQty Application::queryOrderQty() {
  long value;
  std::cout << std::endl << "OrderQty: ";
  std::cin >> value;
  return FIX::OrderQty(value);
}